

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnsrchmp.c
# Opt level: O2

int grad_calc2(custom_function *funcpt,double *x,int N,double *dx,double eps3,double *f)

{
  ulong uVar1;
  char *__format;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  uVar1 = 0;
  if (0 < N) {
    uVar1 = (ulong)(uint)N;
  }
  uVar2 = 0;
  while( true ) {
    if (uVar1 == uVar2) {
      return 0;
    }
    dVar4 = x[uVar2];
    dVar6 = dVar4;
    if (ABS(dVar4) < 1.0 / ABS(dx[uVar2])) {
      dVar4 = signx(dVar4);
      dVar4 = dVar4 / ABS(dx[uVar2]);
      dVar6 = x[uVar2];
    }
    dVar5 = dVar4 * eps3 + dVar6;
    x[uVar2] = dVar5;
    dVar4 = (*funcpt->funcpt)(x,N,funcpt->params);
    if (1.79769313486232e+308 <= ABS(dVar4)) break;
    if (NAN(dVar4)) {
LAB_0013d7c1:
      __format = "Program Exiting as the function returns NaN";
      goto LAB_0013d7c8;
    }
    dVar5 = dVar5 - dVar6;
    x[uVar2] = dVar6 - dVar5;
    dVar3 = (*funcpt->funcpt)(x,N,funcpt->params);
    if (1.79769313486232e+308 <= ABS(dVar3)) break;
    if (NAN(dVar3)) goto LAB_0013d7c1;
    f[uVar2] = (dVar4 - dVar3) / (dVar5 + dVar5);
    x[uVar2] = dVar6;
    uVar2 = uVar2 + 1;
  }
  __format = "Program Exiting as the function value exceeds the maximum double value";
LAB_0013d7c8:
  printf(__format);
  return 0xf;
}

Assistant:

int grad_calc2(custom_function *funcpt, double *x, int N, double *dx, double eps3, double *f) {
	int j,retval;
	double stepsize,stepmax,temp;
	double fp,fm;

	retval = 0;

	for (j = 0; j < N;++j) {
		if (fabs(x[j]) >= 1.0 / fabs(dx[j])) {
			stepmax = x[j];
		}
		else {
			stepmax = signx(x[j]) * 1.0 / fabs(dx[j]);
		}

		stepsize = stepmax * eps3;
		temp = x[j];
		x[j] += stepsize;
		stepsize = x[j] - temp;
		fp = FUNCPT_EVAL(funcpt,x,N);
		if (fp >= DBL_MAX || fp <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			return 15;
		}
		if (fp != fp) {
			printf("Program Exiting as the function returns NaN");
			return 15;
		}
		x[j] = temp - stepsize;
		fm = FUNCPT_EVAL(funcpt,x,N);
		if (fm >= DBL_MAX || fm <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			return 15;
		}
		if (fm != fm) {
			printf("Program Exiting as the function returns NaN");
			return 15;
		}
		f[j] = (fp - fm)/ (2 * stepsize);
		x[j] = temp;
	}

	return retval;
}